

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaFrames.c
# Opt level: O0

void Gia_ManUnrollDup_rec(Gia_Man_t *pNew,Gia_Obj_t *pObj,int Id)

{
  int iVar1;
  uint uVar2;
  int iLit1;
  Gia_Obj_t *pGVar3;
  int Id_local;
  Gia_Obj_t *pObj_local;
  Gia_Man_t *pNew_local;
  
  if (pObj->Value == 0xffffffff) {
    iVar1 = Gia_ObjIsCi(pObj);
    if (iVar1 == 0) {
      iVar1 = Gia_ObjIsCo(pObj);
      if (iVar1 == 0) {
        iVar1 = Gia_ObjIsAnd(pObj);
        if (iVar1 == 0) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/giaFrames.c"
                        ,0x5c,"void Gia_ManUnrollDup_rec(Gia_Man_t *, Gia_Obj_t *, int)");
        }
        pGVar3 = Gia_ObjFanin0(pObj);
        iVar1 = Gia_ObjFaninId0(pObj,Id);
        Gia_ManUnrollDup_rec(pNew,pGVar3,iVar1);
        pGVar3 = Gia_ObjFanin1(pObj);
        iVar1 = Gia_ObjFaninId1(pObj,Id);
        Gia_ManUnrollDup_rec(pNew,pGVar3,iVar1);
        iVar1 = Gia_ObjFanin0Copy(pObj);
        iLit1 = Gia_ObjFanin1Copy(pObj);
        uVar2 = Gia_ManAppendAnd(pNew,iVar1,iLit1);
        pObj->Value = uVar2;
      }
      else {
        pGVar3 = Gia_ObjFanin0(pObj);
        iVar1 = Gia_ObjFaninId0(pObj,Id);
        Gia_ManUnrollDup_rec(pNew,pGVar3,iVar1);
        iVar1 = Gia_ObjFanin0Copy(pObj);
        uVar2 = Gia_ManAppendCo(pNew,iVar1);
        pObj->Value = uVar2;
      }
    }
    else {
      uVar2 = Gia_ManAppendCi(pNew);
      pObj->Value = uVar2;
    }
    iVar1 = Abc_Lit2Var(pObj->Value);
    pGVar3 = Gia_ManObj(pNew,iVar1);
    pGVar3->Value = Id;
  }
  return;
}

Assistant:

void Gia_ManUnrollDup_rec( Gia_Man_t * pNew, Gia_Obj_t * pObj, int Id ) 
{
    if ( ~pObj->Value )
        return;
    if ( Gia_ObjIsCi(pObj) )
        pObj->Value = Gia_ManAppendCi(pNew);
    else if ( Gia_ObjIsCo(pObj) )
    {
        Gia_ManUnrollDup_rec( pNew, Gia_ObjFanin0(pObj), Gia_ObjFaninId0(pObj, Id) );
        pObj->Value = Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
    }
    else if ( Gia_ObjIsAnd(pObj) )
    {
        Gia_ManUnrollDup_rec( pNew, Gia_ObjFanin0(pObj), Gia_ObjFaninId0(pObj, Id) );
        Gia_ManUnrollDup_rec( pNew, Gia_ObjFanin1(pObj), Gia_ObjFaninId1(pObj, Id) );
        pObj->Value = Gia_ManAppendAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
    }
    else assert( 0 );
    Gia_ManObj(pNew, Abc_Lit2Var(pObj->Value))->Value = Id;
}